

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

void slang::ast::builtins::registerQueryFuncs(Compilation *c)

{
  pointer *__ptr;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_78;
  undefined1 local_69;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_68;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_60;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_58;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_50;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_48;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_40;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_38;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_30;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_28;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_20;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_18;
  
  std::make_unique<slang::ast::builtins::BitsFunction>();
  local_18._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_18);
  if (local_18._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_18._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_18._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::TypenameFunction>();
  local_20._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_20);
  if (local_20._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_20._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_20._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::IsUnboundedFunction>();
  local_28._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_28);
  if (local_28._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_28._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_28._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::LowFunction>();
  local_30._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_30);
  if (local_30._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_30._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_30._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::HighFunction>();
  local_38._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_38);
  if (local_38._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_38._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_38._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::LeftFunction>();
  local_40._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_40);
  if (local_40._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_40._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_40._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::RightFunction>();
  local_48._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_48);
  if (local_48._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_48._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_48._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::SizeFunction>();
  local_50._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_50);
  if (local_50._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_50._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_50._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::IncrementFunction>();
  local_58._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_58);
  if (local_58._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_58._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_58._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_69 = 0;
  std::make_unique<slang::ast::builtins::ArrayDimensionFunction,char_const(&)[12],bool>
            ((char (*) [12])&local_78,(bool *)"$dimensions");
  local_60._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_60);
  if (local_60._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_60._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_60._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_69 = 1;
  std::make_unique<slang::ast::builtins::ArrayDimensionFunction,char_const(&)[21],bool>
            ((char (*) [21])&local_78,(bool *)"$unpacked_dimensions");
  local_68._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_68);
  if (local_68._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_68._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_68._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  return;
}

Assistant:

void registerQueryFuncs(Compilation& c) {
#define REGISTER(name) c.addSystemSubroutine(std::make_unique<name##Function>())
    REGISTER(Bits);
    REGISTER(Typename);
    REGISTER(IsUnbounded);
    REGISTER(Low);
    REGISTER(High);
    REGISTER(Left);
    REGISTER(Right);
    REGISTER(Size);
    REGISTER(Increment);
#undef REGISTER

    c.addSystemSubroutine(std::make_unique<ArrayDimensionFunction>("$dimensions", false));
    c.addSystemSubroutine(std::make_unique<ArrayDimensionFunction>("$unpacked_dimensions", true));
}